

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Gia_Man_t * Gia_ManDupMuxesNoHash(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  uint local_3c;
  Gia_Obj_t *local_38;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0xe5,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  for (iVar15 = 0; iVar1 = p->nObjs, iVar15 < iVar1; iVar15 = iVar15 + 1) {
    pGVar8 = Gia_ManObj(p,iVar15);
    if (pGVar8 == (Gia_Obj_t *)0x0) {
      iVar1 = p->nObjs;
      break;
    }
    if (((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) &&
       (iVar1 = Gia_ObjIsMuxType(pGVar8), iVar1 != 0)) {
      Gia_ObjRefDec(p,pGVar8 + -(*(ulong *)pGVar8 & 0x1fffffff));
      Gia_ObjRefDec(p,pGVar8 + -((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
    }
  }
  p_00 = Gia_ManStart(iVar1);
  pcVar9 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar9;
  pcVar9 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar9;
  puVar10 = (uint *)calloc((long)p_00->nObjsAlloc,4);
  p_00->pMuxes = puVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar15 = 0; iVar15 < p->vCis->nSize; iVar15 = iVar15 + 1) {
    iVar1 = Vec_IntEntry(p->vCis,iVar15);
    pGVar8 = Gia_ManObj(p,iVar1);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar8->Value = uVar2;
  }
  lVar17 = 0;
  while ((lVar17 < p->nObjs && (pGVar8 = Gia_ManObj(p,(int)lVar17), pGVar8 != (Gia_Obj_t *)0x0))) {
    if (((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) &&
       (p->pRefs[lVar17] != 0)) {
      iVar15 = Gia_ObjIsMuxType(pGVar8);
      if (iVar15 == 0) {
        uVar2 = Gia_ObjFanin0Copy(pGVar8);
        uVar3 = Gia_ObjFanin1Copy(pGVar8);
        pGVar12 = Gia_ManAppendObj(p_00);
        iVar15 = Abc_Lit2Var(uVar2);
        if (p_00->nObjs <= iVar15) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        iVar15 = Abc_Lit2Var(uVar3);
        if (p_00->nObjs <= iVar15) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if (p_00->fGiaSimple == 0) {
          iVar15 = Abc_Lit2Var(uVar2);
          iVar1 = Abc_Lit2Var(uVar3);
          if (iVar15 == iVar1) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
        }
        iVar15 = Gia_ObjId(p_00,pGVar12);
        iVar1 = Abc_Lit2Var(uVar2);
        uVar13 = (ulong)(iVar15 - iVar1 & 0x1fffffff);
        if (uVar2 < uVar3) {
          *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xffffffffe0000000 | uVar13;
          iVar15 = Abc_LitIsCompl(uVar2);
          *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xffffffffdfffffff | (ulong)(uint)(iVar15 << 0x1d)
          ;
          iVar15 = Gia_ObjId(p_00,pGVar12);
          iVar1 = Abc_Lit2Var(uVar3);
          *(ulong *)pGVar12 =
               *(ulong *)pGVar12 & 0xe0000000ffffffff | (ulong)(iVar15 - iVar1 & 0x1fffffff) << 0x20
          ;
          uVar2 = Abc_LitIsCompl(uVar3);
          uVar11 = (ulong)uVar2 << 0x3d;
          uVar13 = *(ulong *)pGVar12;
          uVar14 = 0xdfffffffffffffff;
        }
        else {
          *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xe0000000ffffffff | uVar13 << 0x20;
          uVar2 = Abc_LitIsCompl(uVar2);
          *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xdfffffffffffffff | (ulong)uVar2 << 0x3d;
          iVar15 = Gia_ObjId(p_00,pGVar12);
          iVar1 = Abc_Lit2Var(uVar3);
          *(ulong *)pGVar12 =
               *(ulong *)pGVar12 & 0xffffffffe0000000 | (ulong)(iVar15 - iVar1 & 0x1fffffff);
          iVar15 = Abc_LitIsCompl(uVar3);
          uVar11 = (ulong)(uint)(iVar15 << 0x1d);
          uVar13 = *(ulong *)pGVar12;
          uVar14 = 0xffffffffdfffffff;
        }
        *(ulong *)pGVar12 = uVar13 & uVar14 | uVar11;
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar12 + -(uVar13 & uVar14 & 0x1fffffff),pGVar12);
          Gia_ObjAddFanout(p_00,pGVar12 + -((ulong)*(uint *)&pGVar12->field_0x4 & 0x1fffffff),
                           pGVar12);
        }
        if (p_00->fSweeper != 0) {
          uVar11 = *(ulong *)pGVar12 & 0x1fffffff;
          uVar13 = *(ulong *)pGVar12 >> 0x20 & 0x1fffffff;
          uVar14 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar12 + -uVar11) >> 0x1e & 1) == 0) {
            uVar14 = 0x40000000;
          }
          *(ulong *)(pGVar12 + -uVar11) = uVar14 | *(ulong *)(pGVar12 + -uVar11);
          uVar14 = *(ulong *)(pGVar12 + -uVar13);
          uVar16 = 0x4000000000000000;
          if (((uint)uVar14 >> 0x1e & 1) == 0) {
            uVar16 = 0x40000000;
          }
          *(ulong *)(pGVar12 + -uVar13) = uVar16 | uVar14;
          uVar13 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 =
               uVar13 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar13 >> 0x3d) ^ (uint)(uVar14 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar12 + -uVar11) >> 0x3f) ^
                      (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
        }
        iVar15 = Gia_ObjId(p_00,pGVar12);
        uVar2 = iVar15 * 2;
      }
      else {
        iVar15 = Gia_ObjRecognizeExor(pGVar8,&pFan0,&pFan1);
        if (iVar15 == 0) {
          pGVar12 = Gia_ObjRecognizeMux(pGVar8,&pFan1,&pFan0);
          iVar15 = Gia_ObjToLit(p,pFan0);
          uVar2 = Gia_ObjLitCopy(p,iVar15);
          iVar15 = Gia_ObjToLit(p,pFan1);
          uVar3 = Gia_ObjLitCopy(p,iVar15);
          if (uVar2 != uVar3) {
            iVar15 = Abc_Lit2Var(uVar2);
            iVar1 = Abc_Lit2Var(uVar3);
            iVar6 = Gia_ObjToLit(p,pGVar12);
            uVar3 = Gia_ObjLitCopy(p,iVar6);
            if (iVar15 == iVar1) {
              uVar4 = Abc_LitIsCompl(uVar2);
              uVar5 = Abc_LitIsCompl(uVar3);
              uVar2 = Gia_ManAppendXorReal(p_00,uVar2 & 0x7ffffffe,uVar3 & 0x7ffffffe);
              uVar2 = uVar2 ^ uVar5 ^ uVar4;
            }
            else {
              iVar15 = Gia_ObjToLit(p,pFan1);
              iVar15 = Gia_ObjLitCopy(p,iVar15);
              iVar1 = Gia_ObjToLit(p,pFan0);
              iVar1 = Gia_ObjLitCopy(p,iVar1);
              pGVar12 = Gia_ManAppendObj(p_00);
              if (p_00->pMuxes == (uint *)0x0) {
                __assert_fail("p->pMuxes != NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2c5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar6 = Abc_Lit2Var(iVar1);
              if (p_00->nObjs <= iVar6) {
                __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2c6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar6 = Abc_Lit2Var(iVar15);
              if (p_00->nObjs <= iVar6) {
                __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2c7,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar6 = Abc_Lit2Var(uVar3);
              if (p_00->nObjs <= iVar6) {
                __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2c8,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              local_38 = pGVar12;
              iVar6 = Abc_Lit2Var(iVar1);
              iVar7 = Abc_Lit2Var(iVar15);
              if (iVar6 == iVar7) {
                __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2c9,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar6 = Abc_Lit2Var(uVar3);
              iVar7 = Abc_Lit2Var(iVar1);
              if (iVar6 == iVar7) {
                __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2ca,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar6 = Abc_Lit2Var(uVar3);
              iVar7 = Abc_Lit2Var(iVar15);
              pGVar12 = local_38;
              if (iVar6 == iVar7) {
                __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2cb,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              if ((p_00->pHTable != (int *)0x0) && (iVar6 = Abc_LitIsCompl(iVar15), iVar6 != 0)) {
                __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x2cc,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              local_3c = Abc_Lit2Var(iVar1);
              uVar2 = Abc_Lit2Var(iVar15);
              iVar6 = Gia_ObjId(p_00,pGVar12);
              iVar7 = Abc_Lit2Var(iVar1);
              uVar13 = (ulong)(iVar6 - iVar7 & 0x1fffffff);
              if (local_3c < uVar2) {
                *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xffffffffe0000000 | uVar13;
                iVar1 = Abc_LitIsCompl(iVar1);
                *(ulong *)pGVar12 =
                     *(ulong *)pGVar12 & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
                iVar1 = Gia_ObjId(p_00,pGVar12);
                iVar6 = Abc_Lit2Var(iVar15);
                *(ulong *)pGVar12 =
                     *(ulong *)pGVar12 & 0xe0000000ffffffff |
                     (ulong)(iVar1 - iVar6 & 0x1fffffff) << 0x20;
                uVar2 = Abc_LitIsCompl(iVar15);
                *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xdfffffffffffffff | (ulong)uVar2 << 0x3d;
              }
              else {
                *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xe0000000ffffffff | uVar13 << 0x20;
                uVar2 = Abc_LitIsCompl(iVar1);
                *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xdfffffffffffffff | (ulong)uVar2 << 0x3d;
                iVar1 = Gia_ObjId(p_00,pGVar12);
                iVar6 = Abc_Lit2Var(iVar15);
                *(ulong *)pGVar12 =
                     *(ulong *)pGVar12 & 0xffffffffe0000000 | (ulong)(iVar1 - iVar6 & 0x1fffffff);
                iVar15 = Abc_LitIsCompl(iVar15);
                *(ulong *)pGVar12 =
                     *(ulong *)pGVar12 & 0xffffffffdfffffff | (ulong)(uint)(iVar15 << 0x1d);
                uVar3 = Abc_LitNot(uVar3);
              }
              puVar10 = p_00->pMuxes;
              iVar15 = Gia_ObjId(p_00,pGVar12);
              puVar10[iVar15] = uVar3;
              p_00->nMuxes = p_00->nMuxes + 1;
              iVar15 = Gia_ObjId(p_00,pGVar12);
              uVar2 = iVar15 * 2;
            }
          }
        }
        else {
          iVar15 = Gia_ObjToLit(p,pFan0);
          uVar2 = Gia_ObjLitCopy(p,iVar15);
          iVar15 = Gia_ObjToLit(p,pFan1);
          uVar3 = Gia_ObjLitCopy(p,iVar15);
          uVar4 = Abc_LitIsCompl(uVar2);
          uVar5 = Abc_LitIsCompl(uVar3);
          uVar2 = Gia_ManAppendXorReal(p_00,uVar2 & 0x7ffffffe,uVar3 & 0x7ffffffe);
          uVar2 = uVar2 ^ uVar5 ^ uVar4;
        }
      }
      pGVar8->Value = uVar2;
    }
    lVar17 = lVar17 + 1;
  }
  for (iVar15 = 0; iVar15 < p->vCos->nSize; iVar15 = iVar15 + 1) {
    iVar1 = Vec_IntEntry(p->vCos,iVar15);
    pGVar8 = Gia_ManObj(p,iVar1);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFanin0Copy(pGVar8);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGVar8->Value = uVar2;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar15 = Gia_ManHasDangling(p_00);
  if (iVar15 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x11a,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxesNoHash( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, iLit0, iLit1, fCompl;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // discount nodes with one fanout pointed to by MUX type
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        Gia_ObjRefDec(p, Gia_ObjFanin0(pObj));
        Gia_ObjRefDec(p, Gia_ObjFanin1(pObj));
    }
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName  = Abc_UtilStrsav( p->pName );
    pNew->pSpec  = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNumId(p, i) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
        {
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
            pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
        }
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            if ( iLit0 == iLit1 )
                pObj->Value = iLit0;
            else if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
            {
                iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC));
                fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
                pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
            }
            else
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling(pNew) );
    return pNew;
}